

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

string * __thiscall
cmCTestHG::GetWorkingRevision_abi_cxx11_(string *__return_storage_ptr__,cmCTestHG *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_332;
  allocator<char> local_331;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_identify;
  string local_318;
  string hg;
  OutputLogger err;
  IdentifyParser out;
  
  std::__cxx11::string::string
            ((string *)&hg,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool)
  ;
  std::__cxx11::string::string((string *)&out,(string *)&hg);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out.super_LineParser.Line._M_string_length,"identify",
             (allocator<char> *)&err);
  std::__cxx11::string::string<std::allocator<char>>((string *)&out.Rev,"-i",&local_331);
  __l._M_len = 3;
  __l._M_array = (iterator)&out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&hg_identify,__l,&local_332);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)((long)out.RegexIdentify.regmatch.startp + lVar1 + -0x48));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  IdentifyParser::IdentifyParser(&out,this,"rev-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-err> ");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&hg_identify,(OutputParser *)&out,(OutputParser *)&err,
                      &local_318,Auto);
  std::__cxx11::string::~string((string *)&local_318);
  cmProcessTools::LineParser::~LineParser(&err.super_LineParser);
  IdentifyParser::~IdentifyParser(&out);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&hg_identify);
  std::__cxx11::string::~string((string *)&hg);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestHG::GetWorkingRevision()
{
  // Run plumbing "hg identify" to get work tree revision.
  std::string hg = this->CommandLineTool;
  std::vector<std::string> hg_identify = { hg, "identify", "-i" };
  std::string rev;
  IdentifyParser out(this, "rev-out> ", rev);
  OutputLogger err(this->Log, "rev-err> ");
  this->RunChild(hg_identify, &out, &err);
  return rev;
}